

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<kj::CappedArray<char,_5UL>_>::~Array(Array<kj::CappedArray<char,_5UL>_> *this)

{
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }